

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-player.c
# Opt level: O1

void media_player2_player_skeleton_init(MediaPlayer2PlayerSkeleton *skeleton)

{
  long lVar1;
  GMainContext *pGVar2;
  GValue *pGVar3;
  
  lVar1 = (long)MediaPlayer2PlayerSkeleton_private_offset;
  skeleton->priv =
       (MediaPlayer2PlayerSkeletonPrivate *)
       ((long)&(skeleton->parent_instance).parent_instance.g_type_instance.g_class + lVar1);
  g_mutex_init((long)&skeleton->priv + lVar1);
  pGVar2 = (GMainContext *)g_main_context_ref_thread_default();
  skeleton->priv->context = pGVar2;
  pGVar3 = (GValue *)g_malloc0(0x168);
  skeleton->priv->properties = pGVar3;
  g_value_init(pGVar3,0x40);
  g_value_init(skeleton->priv->properties + 1,0x40);
  g_value_init(skeleton->priv->properties + 2,0x3c);
  g_value_init(skeleton->priv->properties + 3,0x14);
  g_value_init(skeleton->priv->properties + 4,0x54);
  g_value_init(skeleton->priv->properties + 5,0x3c);
  g_value_init(skeleton->priv->properties + 6,0x28);
  g_value_init(skeleton->priv->properties + 7,0x3c);
  g_value_init(skeleton->priv->properties + 8,0x3c);
  g_value_init(skeleton->priv->properties + 9,0x14);
  g_value_init(skeleton->priv->properties + 10,0x14);
  g_value_init(skeleton->priv->properties + 0xb,0x14);
  g_value_init(skeleton->priv->properties + 0xc,0x14);
  g_value_init(skeleton->priv->properties + 0xd,0x14);
  g_value_init(skeleton->priv->properties + 0xe,0x14);
  return;
}

Assistant:

static void
media_player2_player_skeleton_init (MediaPlayer2PlayerSkeleton *skeleton)
{
#if GLIB_VERSION_MAX_ALLOWED >= GLIB_VERSION_2_38
  skeleton->priv = media_player2_player_skeleton_get_instance_private (skeleton);
#else
  skeleton->priv = G_TYPE_INSTANCE_GET_PRIVATE (skeleton, TYPE_MEDIA_PLAYER2_PLAYER_SKELETON, MediaPlayer2PlayerSkeletonPrivate);
#endif

  g_mutex_init (&skeleton->priv->lock);
  skeleton->priv->context = g_main_context_ref_thread_default ();
  skeleton->priv->properties = g_new0 (GValue, 15);
  g_value_init (&skeleton->priv->properties[0], G_TYPE_STRING);
  g_value_init (&skeleton->priv->properties[1], G_TYPE_STRING);
  g_value_init (&skeleton->priv->properties[2], G_TYPE_DOUBLE);
  g_value_init (&skeleton->priv->properties[3], G_TYPE_BOOLEAN);
  g_value_init (&skeleton->priv->properties[4], G_TYPE_VARIANT);
  g_value_init (&skeleton->priv->properties[5], G_TYPE_DOUBLE);
  g_value_init (&skeleton->priv->properties[6], G_TYPE_INT64);
  g_value_init (&skeleton->priv->properties[7], G_TYPE_DOUBLE);
  g_value_init (&skeleton->priv->properties[8], G_TYPE_DOUBLE);
  g_value_init (&skeleton->priv->properties[9], G_TYPE_BOOLEAN);
  g_value_init (&skeleton->priv->properties[10], G_TYPE_BOOLEAN);
  g_value_init (&skeleton->priv->properties[11], G_TYPE_BOOLEAN);
  g_value_init (&skeleton->priv->properties[12], G_TYPE_BOOLEAN);
  g_value_init (&skeleton->priv->properties[13], G_TYPE_BOOLEAN);
  g_value_init (&skeleton->priv->properties[14], G_TYPE_BOOLEAN);
}